

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O0

void __thiscall
TPZMatrixSolver<float>::Write(TPZMatrixSolver<float> *this,TPZStream *buf,int withclassid)

{
  undefined4 in_EDX;
  TPZSavable *in_RSI;
  TPZSavable *in_RDI;
  TPZStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  
  TPZSavable::Write(in_RSI,(TPZStream *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                    (int)((ulong)in_RDI >> 0x20));
  ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 0x14));
  TPZAutoPointer<TPZMatrix<float>_>::operator->
            ((TPZAutoPointer<TPZMatrix<float>_> *)(in_RDI + 0x14));
  TPZPersistenceManager::WritePointer(in_RDI,in_stack_ffffffffffffffd8);
  ::TPZAutoPointer::operator_cast_to_bool((TPZAutoPointer *)(in_RDI + 1));
  TPZAutoPointer<TPZMatrix<float>_>::operator->((TPZAutoPointer<TPZMatrix<float>_> *)(in_RDI + 1));
  TPZPersistenceManager::WritePointer(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void TPZMatrixSolver<TVar>::Write(TPZStream &buf, int withclassid) const {
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Entering " << __PRETTY_FUNCTION__;
        LOGPZ_DEBUG(logger, sout.str());
    }
#endif
    TPZSolver::Write(buf, withclassid);
    if (fContainer) {
#ifdef PZ_LOG
        {
            std::stringstream sout;
            sout << "fContainer AutoPointer valid on " << __PRETTY_FUNCTION__;
            LOGPZ_DEBUG(logger, sout.str());
        }
#endif
    }
    TPZPersistenceManager::WritePointer(fContainer.operator->(), &buf);
    
    if (fReferenceMatrix) {
#ifdef PZ_LOG
        {
            std::stringstream sout;
            sout << "fReferenceMatrix AutoPointer valid! It Shouldn't ! Expect Trouble " << __PRETTY_FUNCTION__;
            LOGPZ_WARN(logger, sout.str());
        }
#endif
    }
    TPZPersistenceManager::WritePointer(fReferenceMatrix.operator->(), &buf);
    
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Leaving" << __PRETTY_FUNCTION__;
        LOGPZ_DEBUG(logger, sout.str());
    }
#endif
}